

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::outmetrics(tetgenmesh *this,tetgenio *out)

{
  int iVar1;
  tetgenbehavior *ptVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  point pdVar6;
  int *piVar7;
  size_t sVar8;
  FILE *__stream;
  tetgenmesh *ptVar9;
  uint uVar10;
  memorypool *this_00;
  long lVar11;
  char outmtrfilename [1024];
  
  uVar10 = this->sizeoftensor - this->useinsertradius;
  if (uVar10 != 0) {
    ptVar2 = this->b;
    if (out == (tetgenio *)0x0) {
      strcpy(outmtrfilename,ptVar2->outfilename);
      sVar8 = strlen(outmtrfilename);
      builtin_strncpy(outmtrfilename + sVar8,".mtr",5);
      if (ptVar2->quiet == 0) {
        printf("Writing %s.\n",outmtrfilename);
      }
      __stream = fopen(outmtrfilename,"w");
      if (__stream == (FILE *)0x0) {
        printf("File I/O Error:  Cannot create file %s.\n",outmtrfilename);
        terminatetetgen(this,3);
      }
      fprintf(__stream,"%ld  %d\n",this->points->items);
      this_00 = this->points;
    }
    else {
      if (ptVar2->quiet == 0) {
        puts("Writing metrics.");
      }
      out->numberofpointmtrs = uVar10;
      this_00 = this->points;
      uVar4 = (long)(int)uVar10 * this_00->items;
      __stream = (FILE *)0x0;
      pdVar5 = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
      out->pointmtrlist = pdVar5;
    }
    memorypool::traversalinit(this_00);
    pdVar6 = pointtraverse(this);
    iVar3 = 0;
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    while (pdVar6 != (point)0x0) {
      if (out == (tetgenio *)0x0) {
        for (lVar11 = 0; uVar10 != (uint)lVar11; lVar11 = lVar11 + 1) {
          fprintf(__stream," %-16.8e",pdVar6[this->pointmtrindex + lVar11]);
        }
        fputc(10,__stream);
      }
      else {
        iVar1 = this->pointmtrindex;
        for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
          out->pointmtrlist[(long)iVar3 + uVar4] = pdVar6[(long)iVar1 + uVar4];
        }
        iVar3 = iVar3 + (int)uVar4;
      }
      pdVar6 = pointtraverse(this);
    }
    ptVar2 = this->b;
    if (out == (tetgenio *)0x0) {
      strcpy(outmtrfilename,ptVar2->outfilename);
      sVar8 = strlen(outmtrfilename);
      builtin_strncpy(outmtrfilename + sVar8,".p2t",5);
      if (ptVar2->quiet == 0) {
        printf("Writing %s.\n",outmtrfilename);
      }
      __stream = fopen(outmtrfilename,"w");
      if (__stream == (FILE *)0x0) {
        __stream = (FILE *)0x0;
        printf("File I/O Error:  Cannot create file %s.\n",outmtrfilename);
        terminatetetgen(this,3);
      }
    }
    else {
      if (ptVar2->quiet == 0) {
        puts("Writing point-to-tet map.");
      }
      uVar4 = this->points->items;
      piVar7 = (int *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 << 2);
      out->point2tetlist = piVar7;
    }
    if (this->bgm != (tetgenmesh *)0x0) {
      indexelements(this->bgm);
    }
    uVar10 = 0;
    if (this->b->zeroindex == 0) {
      uVar10 = this->in->firstnumber;
    }
    memorypool::traversalinit(this->points);
    pdVar6 = pointtraverse(this);
    lVar11 = 0;
    while (pdVar6 != (point)0x0) {
      ptVar9 = this->bgm;
      if (this->bgm != (tetgenmesh *)0x0) {
        ptVar9 = (tetgenmesh *)0x18;
      }
      if (out == (tetgenio *)0x0) {
        fprintf(__stream,"%d  %d\n",lVar11 + (ulong)uVar10);
      }
      else {
        out->point2tetlist[lVar11] =
             *(int *)((*(ulong *)((long)&ptVar9->in + (long)(pdVar6 + this->point2simindex)) &
                      0xfffffffffffffff0) + 0x50);
      }
      lVar11 = lVar11 + 1;
      pdVar6 = pointtraverse(this);
    }
    if (out == (tetgenio *)0x0) {
      fprintf(__stream,"# Generated by %s\n",this->b->commandline);
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void tetgenmesh::outmetrics(tetgenio* out)
{
  FILE *outfile = NULL;
  char outmtrfilename[FILENAMESIZE];
  point ptloop;
  int mtrindex = 0;
  int i;
  int msize = (sizeoftensor - useinsertradius);
  if (msize == 0) {
    return;
  }

  if (out == (tetgenio *) NULL) {
    strcpy(outmtrfilename, b->outfilename);
    strcat(outmtrfilename, ".mtr");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outmtrfilename);
    } else {
      printf("Writing metrics.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(outmtrfilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outmtrfilename);
      terminatetetgen(this, 3);
    }
    // Number of points, number of point metrices,
    fprintf(outfile, "%ld  %d\n", points->items, msize);
  } else {
    // Allocate space for 'pointmtrlist'.
    out->numberofpointmtrs = msize; 
    out->pointmtrlist = new REAL[points->items * msize];
    if (out->pointmtrlist == (REAL *) NULL) {
      terminatetetgen(this, 1);
    }
  }

  points->traversalinit();
  ptloop = pointtraverse();
  while (ptloop != (point) NULL) {
    if (out == (tetgenio *) NULL) {
      for (i = 0; i < msize; i++) {
        fprintf(outfile, " %-16.8e", ptloop[pointmtrindex + i]);
      }
      fprintf(outfile, "\n");
    } else {
      for (i = 0; i < msize; i++) {
        out->pointmtrlist[mtrindex++] = ptloop[pointmtrindex + i];
      }
    }
    ptloop = pointtraverse();
  }

  // Output the point-to-tet map.
  if (out == (tetgenio *) NULL) {
    strcpy(outmtrfilename, b->outfilename);
    strcat(outmtrfilename, ".p2t");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outmtrfilename);
    } else {
      printf("Writing point-to-tet map.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(outmtrfilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outmtrfilename);
      terminatetetgen(this, 3);
    }
    // Number of points,
    //fprintf(outfile, "%ld\n", points->items);
  } else {
    // Allocate space for 'point2tetlist'.
    out->point2tetlist = new int[points->items];
    if (out->point2tetlist == (int *) NULL) {
      terminatetetgen(this, 1);
    }
  }

  // The list of tetrahedra must be indexed.
  if (bgm != NULL) {
    bgm->indexelements();
  }
  // Determine the first index (0 or 1).
  int firstindex = b->zeroindex ? 0 : in->firstnumber;
  int pointindex = firstindex;
  i = 0;

  triface parenttet;
  points->traversalinit();
  ptloop = pointtraverse();
  while (ptloop != (point) NULL) {
    if (bgm != NULL) {
	  bgm->decode(point2bgmtet(ptloop), parenttet);
	} else {
	  decode(point2tet(ptloop), parenttet);
	}
    if (out == (tetgenio *) NULL) {
      fprintf(outfile, "%d  %d\n", pointindex, elemindex(parenttet.tet));
    } else {
      out->point2tetlist[i] = elemindex(parenttet.tet);
    }
	pointindex++;
	i++;
    ptloop = pointtraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}